

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
MultiState<false>::StartArray(MultiState<false> *this,Context<false> *ctx)

{
  example *peVar1;
  vw_exception *this_00;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  if (ctx->all->label_type == cb) {
    peVar1 = ctx->ex;
    uniform_hash("shared",6,0);
    ___msg = 3.4028235e+38;
    v_array<CB::cb_class>::push_back
              ((v_array<CB::cb_class> *)&(peVar1->l).simple,(cb_class *)&__msg);
    return &this->super_BaseState<false>;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_190,"label type is not CB");
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_example_json.h"
             ,0x1a7,&local_1c0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

BaseState<audit>* StartArray(Context<audit>& ctx)
  {
    // mark shared example
    if (ctx.all->label_type == label_type::cb)
    {
      CB::label* ld = &ctx.ex->l.cb;
      CB::cb_class f;

      f.partial_prediction = 0.;
      f.action = (uint32_t)uniform_hash("shared", 6, 0);
      f.cost = FLT_MAX;
      f.probability = -1.f;

      ld->costs.push_back(f);
    }
    else
      THROW("label type is not CB")

    return this;
  }